

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O1

void term_cancel_selection_drag(Terminal *term)

{
  if (term->selstate == DRAGGING) {
    term->selstate = LEXICOGRAPHIC;
  }
  term_out(term,false);
  if (term->window_update_pending != false) {
    return;
  }
  term->window_update_pending = true;
  queue_toplevel_callback(term_update_callback,term);
  return;
}

Assistant:

void term_cancel_selection_drag(Terminal *term)
{
    /*
     * In unusual circumstances, a mouse drag might be interrupted by
     * something that steals the rest of the mouse gesture. An example
     * is the GTK popup menu appearing. In that situation, we'll never
     * receive the MA_RELEASE that finishes the DRAGGING state, which
     * means terminal output could be suppressed indefinitely. Call
     * this function from the front end in such situations to restore
     * sensibleness.
     */
    if (term->selstate == DRAGGING)
        term->selstate = NO_SELECTION;
    term_out(term, false);
    term_schedule_update(term);
}